

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_error.c
# Opt level: O0

int qc_seterr(QcErr *err,int errcode,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1f8 [24];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined4 local_148;
  undefined4 local_144;
  va_list vl;
  char local_128 [8];
  char vs [255];
  char *fmt_local;
  int errcode_local;
  QcErr *err_local;
  
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Qa;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  if (err == (QcErr *)0x0) {
    err_local._4_4_ = -1;
  }
  else {
    local_1e0 = in_RCX;
    local_1d8 = in_R8;
    local_1d0 = in_R9;
    unique0x1000012c = fmt;
    memset(err,0,0x104);
    err->code = errcode;
    vl[0].overflow_arg_area = local_1f8;
    vl[0]._0_8_ = &stack0x00000008;
    local_144 = 0x30;
    local_148 = 0x18;
    vsnprintf(local_128,0xff,stack0xffffffffffffffd8,&local_148);
    strncpy(err->desc,local_128,0xff);
    err_local._4_4_ = 0;
  }
  return err_local._4_4_;
}

Assistant:

int qc_seterr(QcErr *err, int errcode, const char *fmt, ...){
    if(NULL == err)
        return -1;
    
    memset(err, 0, sizeof(QcErr));
    err->code = errcode;

    char vs[QC_MAXSIZE_ERRDESC];
    va_list vl;
    va_start(vl, fmt);
    vsnprintf(vs, sizeof(vs), fmt, vl);
    strncpy(err->desc, vs, sizeof(vs));
    va_end(vl);

    return 0;
}